

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupWithConstraints(Gia_Man_t *p,Vec_Int_t *vPoTypes)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Gia_Obj_t *pGVar5;
  int iVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *pcVar9;
  Gia_Obj_t *pGVar10;
  Vec_Int_t *pVVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pName = pcVar9;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar9 = (char *)0x0;
  }
  else {
    sVar8 = strlen(pcVar3);
    pcVar9 = (char *)malloc(sVar8 + 1);
    strcpy(pcVar9,pcVar3);
  }
  p_00->pSpec = pcVar9;
  p->pObjs->Value = 0;
  pVVar11 = p->vCis;
  if (0 < pVVar11->nSize) {
    lVar14 = 0;
    do {
      iVar6 = pVVar11->pArray[lVar14];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001ed184;
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      pGVar10 = Gia_ManAppendObj(p_00);
      uVar12 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar12 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar12 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) {
LAB_001ed1c2:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * -0x55555555);
      pGVar5 = p_00->pObjs;
      if ((pGVar10 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar10)) goto LAB_001ed1c2;
      pGVar4[iVar6].Value = (int)((ulong)((long)pGVar10 - (long)pGVar5) >> 2) * 0x55555556;
      lVar14 = lVar14 + 1;
      pVVar11 = p->vCis;
    } while (lVar14 < pVVar11->nSize);
  }
  if (0 < p->nObjs) {
    lVar14 = 8;
    lVar15 = 0;
    do {
      pGVar4 = p->pObjs;
      if (pGVar4 == (Gia_Obj_t *)0x0) break;
      uVar12 = *(ulong *)((long)pGVar4 + lVar14 + -8);
      if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
        uVar7 = *(uint *)((long)pGVar4 +
                         lVar14 + (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3);
        if (((int)uVar7 < 0) ||
           (uVar1 = *(uint *)((long)pGVar4 +
                             lVar14 + (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar1 < 0)) goto LAB_001ed1e1;
        iVar6 = Gia_ManAppendAnd(p_00,uVar7 ^ (uint)(uVar12 >> 0x1d) & 1,
                                 uVar1 ^ (uint)(uVar12 >> 0x3d) & 1);
        *(int *)(&pGVar4->field_0x0 + lVar14) = iVar6;
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 0xc;
    } while (lVar15 < p->nObjs);
  }
  pVVar11 = p->vCos;
  uVar12 = (ulong)(uint)pVVar11->nSize;
  if (p->nRegs < pVVar11->nSize) {
    lVar14 = 0;
    do {
      if ((int)uVar12 <= lVar14) goto LAB_001ed1a3;
      iVar6 = pVVar11->pArray[lVar14];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_001ed184;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vPoTypes->nSize <= lVar14) goto LAB_001ed1a3;
      if (vPoTypes->pArray[lVar14] == 0) {
        pGVar4 = p->pObjs + iVar6;
        if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
        goto LAB_001ed1e1;
        uVar7 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                     pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].
                                     Value);
        pGVar4->Value = uVar7;
      }
      lVar14 = lVar14 + 1;
      pVVar11 = p->vCos;
      uVar12 = (ulong)pVVar11->nSize;
    } while (lVar14 < (long)(uVar12 - (long)p->nRegs));
  }
  pVVar11 = p->vCos;
  uVar12 = (ulong)(uint)pVVar11->nSize;
  iVar6 = 0;
  if (p->nRegs < pVVar11->nSize) {
    lVar14 = 0;
    iVar6 = 0;
    do {
      if ((int)uVar12 <= lVar14) goto LAB_001ed1a3;
      iVar13 = pVVar11->pArray[lVar14];
      if (((long)iVar13 < 0) || (p->nObjs <= iVar13)) goto LAB_001ed184;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if (vPoTypes->nSize <= lVar14) goto LAB_001ed1a3;
      if (vPoTypes->pArray[lVar14] == 1) {
        pGVar4 = p->pObjs + iVar13;
        if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0)
        goto LAB_001ed1e1;
        uVar7 = Gia_ManAppendCo(p_00,pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].
                                     Value ^ (uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^ 1);
        pGVar4->Value = uVar7;
        iVar6 = iVar6 + 1;
      }
      lVar14 = lVar14 + 1;
      pVVar11 = p->vCos;
      uVar12 = (ulong)pVVar11->nSize;
    } while (lVar14 < (long)(uVar12 - (long)p->nRegs));
  }
  iVar13 = p->nRegs;
  if (0 < iVar13) {
    iVar16 = 0;
    do {
      iVar2 = p->vCos->nSize;
      uVar7 = (iVar2 - iVar13) + iVar16;
      if (((int)uVar7 < 0) || (iVar2 <= (int)uVar7)) {
LAB_001ed1a3:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = p->vCos->pArray[uVar7];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
LAB_001ed184:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = p->pObjs + iVar2;
      if ((int)pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value < 0) {
LAB_001ed1e1:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      uVar7 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar4 >> 0x1d & 1 ^
                                   pGVar4[-(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff)].Value)
      ;
      pGVar4->Value = uVar7;
      iVar16 = iVar16 + 1;
      iVar13 = p->nRegs;
    } while (iVar16 < iVar13);
  }
  Gia_ManSetRegNum(p_00,iVar13);
  p_00->nConstrs = iVar6;
  iVar6 = Gia_ManIsNormalized(p_00);
  if (iVar6 != 0) {
    return p_00;
  }
  __assert_fail("Gia_ManIsNormalized(pNew)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0xd40,"Gia_Man_t *Gia_ManDupWithConstraints(Gia_Man_t *, Vec_Int_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupWithConstraints( Gia_Man_t * p, Vec_Int_t * vPoTypes )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i, nConstr = 0;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p, pObj, i )
        pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vPoTypes, i) == 0 ) // regular PO
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManForEachPo( p, pObj, i )
        if ( Vec_IntEntry(vPoTypes, i) == 1 ) // constraint (should be complemented!)
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) ^ 1 ), nConstr++;
    Gia_ManForEachRi( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
//    Gia_ManDupRemapEquiv( pNew, p );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    pNew->nConstrs = nConstr;
    assert( Gia_ManIsNormalized(pNew) );
    return pNew;
}